

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_make_exception(sexp ctx,sexp kind,sexp message,sexp irritants,sexp procedure,sexp source)

{
  sexp psVar1;
  
  psVar1 = (sexp)sexp_alloc(ctx,0x38);
  if ((psVar1 != (sexp)0x0) && ((((ulong)psVar1 & 3) != 0 || (psVar1->tag != 0x13)))) {
    psVar1->tag = 0x13;
  }
  (psVar1->value).type.name = kind;
  (psVar1->value).type.cpl = message;
  (psVar1->value).type.slots = irritants;
  (psVar1->value).type.getters = procedure;
  (psVar1->value).type.setters = source;
  (psVar1->value).type.id = (sexp)0x3e;
  return psVar1;
}

Assistant:

sexp sexp_make_exception (sexp ctx, sexp kind, sexp message, sexp irritants,
                          sexp procedure, sexp source) {
  sexp exn = sexp_alloc_type(ctx, exception, SEXP_EXCEPTION);
  sexp_exception_kind(exn) = kind;
  sexp_exception_message(exn) = message;
  sexp_exception_irritants(exn) = irritants;
  sexp_exception_procedure(exn) = procedure;
  sexp_exception_source(exn) = source;
  sexp_exception_stack_trace(exn) = SEXP_FALSE;
  return exn;
}